

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encryptdict.c
# Opt level: O1

HPDF_STATUS HPDF_EncryptDict_Prepare(HPDF_EncryptDict dict,HPDF_Dict info,HPDF_Xref xref)

{
  HPDF_Encrypt attr;
  HPDF_Binary p_Var1;
  HPDF_STATUS HVar2;
  HPDF_STATUS HVar3;
  HPDF_STATUS HVar4;
  HPDF_STATUS HVar5;
  
  attr = (HPDF_Encrypt)dict->attr;
  HPDF_EncryptDict_CreateID(dict,info,xref);
  HPDF_Encrypt_CreateOwnerKey(attr);
  HPDF_Encrypt_CreateEncryptionKey(attr);
  HPDF_Encrypt_CreateUserKey(attr);
  p_Var1 = HPDF_Binary_New(dict->mmgr,attr->owner_key,0x20);
  if (p_Var1 != (HPDF_Binary)0x0) {
    HVar2 = HPDF_Dict_Add(dict,"O",p_Var1);
    if (HVar2 == 0) {
      p_Var1 = HPDF_Binary_New(dict->mmgr,attr->user_key,0x20);
      if (p_Var1 == (HPDF_Binary)0x0) goto LAB_0011de31;
      HVar2 = HPDF_Dict_Add(dict,"U",p_Var1);
      if (HVar2 == 0) {
        HVar2 = HPDF_Dict_AddName(dict,"Filter","Standard");
        if (attr->mode == HPDF_ENCRYPT_R3) {
          HVar3 = HPDF_Dict_AddNumber(dict,"V",2);
          HVar4 = HPDF_Dict_AddNumber(dict,"R",3);
          HVar5 = HPDF_Dict_AddNumber(dict,"Length",attr->key_len << 3);
          HVar2 = HVar5 + HVar4 + HVar3 + HVar2;
        }
        else if (attr->mode == HPDF_ENCRYPT_R2) {
          HVar3 = HPDF_Dict_AddNumber(dict,"V",1);
          HVar4 = HPDF_Dict_AddNumber(dict,"R",2);
          HVar2 = HVar4 + HVar3 + HVar2;
        }
        HVar3 = HPDF_Dict_AddNumber(dict,"P",attr->permission);
        if (HVar3 + HVar2 != 0) goto LAB_0011de31;
        HVar2 = 0;
      }
    }
    return HVar2;
  }
LAB_0011de31:
  HVar2 = HPDF_Error_GetCode(dict->error);
  return HVar2;
}

Assistant:

HPDF_STATUS
HPDF_EncryptDict_Prepare  (HPDF_EncryptDict  dict,
                           HPDF_Dict         info,
                           HPDF_Xref         xref)
{
    HPDF_STATUS ret;
    HPDF_Encrypt attr = (HPDF_Encrypt)dict->attr;
    HPDF_Binary user_key;
    HPDF_Binary owner_key;

    HPDF_PTRACE((" HPDF_EncryptDict_Prepare\n"));

    HPDF_EncryptDict_CreateID (dict, info, xref);
    HPDF_Encrypt_CreateOwnerKey (attr);
    HPDF_Encrypt_CreateEncryptionKey (attr);
    HPDF_Encrypt_CreateUserKey (attr);

    owner_key = HPDF_Binary_New (dict->mmgr, attr->owner_key, HPDF_PASSWD_LEN);
    if (!owner_key)
        return HPDF_Error_GetCode (dict->error);

    if ((ret = HPDF_Dict_Add (dict, "O", owner_key)) != HPDF_OK)
        return ret;

    user_key = HPDF_Binary_New (dict->mmgr, attr->user_key, HPDF_PASSWD_LEN);
    if (!user_key)
        return HPDF_Error_GetCode (dict->error);

    if ((ret = HPDF_Dict_Add (dict, "U", user_key)) != HPDF_OK)
        return ret;

    ret += HPDF_Dict_AddName (dict, "Filter", "Standard");

    if (attr->mode == HPDF_ENCRYPT_R2) {
        ret += HPDF_Dict_AddNumber (dict, "V", 1);
        ret += HPDF_Dict_AddNumber (dict, "R", 2);
    } else if (attr->mode == HPDF_ENCRYPT_R3) {
        ret += HPDF_Dict_AddNumber (dict, "V", 2);
        ret += HPDF_Dict_AddNumber (dict, "R", 3);
        ret += HPDF_Dict_AddNumber (dict, "Length", attr->key_len * 8);
    }

    ret += HPDF_Dict_AddNumber (dict, "P", attr->permission);

    if (ret != HPDF_OK)
        return HPDF_Error_GetCode (dict->error);

    return HPDF_OK;
}